

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O2

void flatbuffers::tests::NestedListTest(void)

{
  bool expval;
  IDLOptions IStack_a98;
  Parser parser1;
  
  IDLOptions::IDLOptions(&IStack_a98);
  Parser::Parser(&parser1,&IStack_a98);
  IDLOptions::~IDLOptions(&IStack_a98);
  expval = Parser::Parse(&parser1,
                         "struct Test { a:short; b:byte; } table T { F:[Test]; }root_type T;{ F:[ [10,20], [30,40]] }"
                         ,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(expval,true,
                    "\'parser1.Parse(\"struct Test { a:short; b:byte; } table T { F:[Test]; }\" \"root_type T;\" \"{ F:[ [10,20], [30,40]] }\")\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                    ,0x222,"");
  Parser::~Parser(&parser1);
  return;
}

Assistant:

void NestedListTest() {
  flatbuffers::Parser parser1;
  TEST_EQ(parser1.Parse("struct Test { a:short; b:byte; } table T { F:[Test]; }"
                        "root_type T;"
                        "{ F:[ [10,20], [30,40]] }"),
          true);
}